

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

void __thiscall spvtools::opt::CFG::RemoveNonExistingEdges(CFG *this,uint32_t blk_id)

{
  uint32_t *puVar1;
  void *pvVar2;
  long lVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  BasicBlock *this_00;
  iterator iVar5;
  uint32_t *puVar6;
  bool has_branch;
  uint32_t id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> updated_pred_list;
  char local_7d;
  uint32_t local_7c;
  void *local_78;
  iterator iStack_70;
  uint *local_68;
  uint32_t local_54;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_78 = (void *)0x0;
  iStack_70._M_current = (uint *)0x0;
  local_68 = (uint *)0x0;
  local_54 = blk_id;
  pvVar4 = preds(this,blk_id);
  puVar6 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (pvVar4->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar6 != puVar1) {
    do {
      local_7c = *puVar6;
      this_00 = block(this,local_7c);
      local_7d = '\0';
      local_50._M_unused._M_object = &local_7d;
      local_50._12_4_ = 0;
      local_50._8_4_ = blk_id;
      local_38 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:64:37)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:64:37)>
                 ::_M_manager;
      BasicBlock::ForEachSuccessorLabel(this_00,(function<void_(unsigned_int)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (local_7d == '\x01') {
        if (iStack_70._M_current == local_68) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,iStack_70,
                     &local_7c);
        }
        else {
          *iStack_70._M_current = local_7c;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  iVar5 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->label2preds_)._M_h,&local_54);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    pvVar2 = *(void **)((long)iVar5.
                              super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                              ._M_cur + 0x10);
    lVar3 = *(long *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                            ._M_cur + 0x20);
    *(void **)((long)iVar5.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                     ._M_cur + 0x10) = local_78;
    *(uint **)((long)iVar5.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                     ._M_cur + 0x18) = iStack_70._M_current;
    *(uint **)((long)iVar5.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
                     ._M_cur + 0x20) = local_68;
    local_78 = (void *)0x0;
    iStack_70._M_current = (uint *)0x0;
    local_68 = (uint *)0x0;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,lVar3 - (long)pvVar2);
      if (local_78 != (void *)0x0) {
        operator_delete(local_78,(long)local_68 - (long)local_78);
      }
    }
    return;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void CFG::RemoveNonExistingEdges(uint32_t blk_id) {
  std::vector<uint32_t> updated_pred_list;
  for (uint32_t id : preds(blk_id)) {
    const BasicBlock* pred_blk = block(id);
    bool has_branch = false;
    pred_blk->ForEachSuccessorLabel([&has_branch, blk_id](uint32_t succ) {
      if (succ == blk_id) {
        has_branch = true;
      }
    });
    if (has_branch) updated_pred_list.push_back(id);
  }

  label2preds_.at(blk_id) = std::move(updated_pred_list);
}